

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O3

bool spvOpcodeReturnsLogicalVariablePointer(Op opcode)

{
  if ((int)opcode < 0xf5) {
    if (((0x25 < opcode - OpConstantNull) ||
        ((0x200038ea01U >> ((ulong)(opcode - OpConstantNull) & 0x3f) & 1) == 0)) &&
       (opcode != OpSelect)) {
      return false;
    }
  }
  else if ((((5 < opcode - OpUntypedVariableKHR) ||
            ((0x27U >> (opcode - OpUntypedVariableKHR & 0x1f) & 1) == 0)) && (opcode != OpPhi)) &&
          (opcode != OpRawAccessChainNV)) {
    return false;
  }
  return true;
}

Assistant:

bool spvOpcodeReturnsLogicalVariablePointer(const spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
    case spv::Op::OpFunctionParameter:
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpCopyObject:
    case spv::Op::OpSelect:
    case spv::Op::OpPhi:
    case spv::Op::OpFunctionCall:
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpLoad:
    case spv::Op::OpConstantNull:
    case spv::Op::OpRawAccessChainNV:
      return true;
    default:
      return false;
  }
}